

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextGLImpl::BeginQuery(DeviceContextGLImpl *this,IQuery *pQuery)

{
  int iVar1;
  GLuint GVar2;
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginQuery
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pQuery,0);
  if (pQuery != (IQuery *)0x0) {
    CheckDynamicType<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  }
  iVar1 = *(int *)&pQuery[4].super_IDeviceObject.super_IObject._vptr_IObject;
  if (iVar1 - 1U < 5) {
    GVar2 = *(GLuint *)((long)&pQuery[8].super_IDeviceObject.super_IObject._vptr_IObject + 4);
    switch(iVar1) {
    case 1:
      (*__glewBeginQuery)(0x8914,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[40],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645,(char (*) [40])"Failed to begin GL_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645);
      break;
    case 2:
      (*__glewBeginQuery)(0x8c2f,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[44],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d,(char (*) [44])"Failed to begin GL_ANY_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d);
      break;
    case 3:
      goto switchD_00132a8b_caseD_3;
    case 4:
      (*__glewBeginQuery)(0x8c87,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[46],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653,(char (*) [46])"Failed to begin GL_PRIMITIVES_GENERATED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653);
      break;
    case 5:
      (*__glewBeginQuery)(0x88bf,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[38],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c,(char (*) [38])"Failed to begin GL_TIME_ELAPSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c);
    }
  }
  else {
switchD_00132a8b_caseD_3:
    FormatString<char[22]>(&local_38,(char (*) [22])"Unexpected query type");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x663);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BeginQuery(IQuery* pQuery)
{
    TDeviceContextBase::BeginQuery(pQuery, 0);

    QueryGLImpl* pQueryGLImpl = ClassPtrCast<QueryGLImpl>(pQuery);
    QUERY_TYPE   QueryType    = pQueryGLImpl->GetDesc().Type;
    GLuint       glQuery      = pQueryGLImpl->GetGlQueryHandle();

    switch (QueryType)
    {
        case QUERY_TYPE_OCCLUSION:
#if GL_SAMPLES_PASSED
            glBeginQuery(GL_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_SAMPLES_PASSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_SAMPLES_PASSED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_BINARY_OCCLUSION:
            glBeginQuery(GL_ANY_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_ANY_SAMPLES_PASSED query");
            break;

        case QUERY_TYPE_PIPELINE_STATISTICS:
#if GL_PRIMITIVES_GENERATED
            glBeginQuery(GL_PRIMITIVES_GENERATED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_PRIMITIVES_GENERATED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_PRIMITIVES_GENERATED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_DURATION:
#if GL_TIME_ELAPSED
            glBeginQuery(GL_TIME_ELAPSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_TIME_ELAPSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("Duration queries are not supported by this device");
#endif
            break;

        default:
            UNEXPECTED("Unexpected query type");
    }
}